

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rbuSetupOal(sqlite3rbu *p,RbuState *pState)

{
  char *pcVar1;
  char *zRight;
  int iVar2;
  char *pcVar3;
  
  if (pState->zTbl != (char *)0x0) {
    do {
      pcVar3 = (p->objiter).zTbl;
      if (pcVar3 == (char *)0x0) {
LAB_001d29a3:
        pcVar3 = sqlite3_mprintf("rbu_state mismatch error");
        p->zErrmsg = pcVar3;
        iVar2 = 1;
        break;
      }
      if ((p->objiter).bCleanup == 0) {
        pcVar1 = (p->objiter).zIdx;
        zRight = pState->zIdx;
        if ((pcVar1 == (char *)0x0 && zRight == (char *)0x0) ||
           ((pcVar1 != (char *)0x0 && zRight != (char *)0x0 &&
            (iVar2 = sqlite3StrICmp(pcVar1,zRight), iVar2 == 0)))) {
          if (pState->zDataTbl == (char *)0x0) {
            if (pState->zTbl != (char *)0x0) {
              iVar2 = sqlite3StrICmp(pcVar3,pState->zTbl);
              goto joined_r0x001d2995;
            }
          }
          else {
            pcVar1 = (p->objiter).zDataTbl;
            if (pcVar1 != (char *)0x0) {
              iVar2 = sqlite3StrICmp(pcVar1,pState->zDataTbl);
joined_r0x001d2995:
              if (iVar2 == 0) {
                iVar2 = 0;
                if (pcVar3 == (char *)0x0) goto LAB_001d29a3;
                break;
              }
            }
          }
        }
      }
      iVar2 = rbuObjIterNext(p,&p->objiter);
    } while (iVar2 == 0);
    if (iVar2 == 0) {
      iVar2 = pState->nRow;
      p->nStep = iVar2;
      iVar2 = rbuObjIterPrepareAll(p,&p->objiter,iVar2);
    }
    p->rc = iVar2;
  }
  return;
}

Assistant:

static void rbuSetupOal(sqlite3rbu *p, RbuState *pState){
  assert( p->rc==SQLITE_OK );
  if( pState->zTbl ){
    RbuObjIter *pIter = &p->objiter;
    int rc = SQLITE_OK;

    while( rc==SQLITE_OK && pIter->zTbl && (pIter->bCleanup 
       || rbuStrCompare(pIter->zIdx, pState->zIdx)
       || (pState->zDataTbl==0 && rbuStrCompare(pIter->zTbl, pState->zTbl))
       || (pState->zDataTbl && rbuStrCompare(pIter->zDataTbl, pState->zDataTbl))
    )){
      rc = rbuObjIterNext(p, pIter);
    }

    if( rc==SQLITE_OK && !pIter->zTbl ){
      rc = SQLITE_ERROR;
      p->zErrmsg = sqlite3_mprintf("rbu_state mismatch error");
    }

    if( rc==SQLITE_OK ){
      p->nStep = pState->nRow;
      rc = rbuObjIterPrepareAll(p, &p->objiter, p->nStep);
    }

    p->rc = rc;
  }
}